

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlv.cpp
# Opt level: O0

void __thiscall ot::commissioner::tlv::Tlv::Tlv(Tlv *this,Type aType,int8_t aValue,Scope aScope)

{
  int8_t local_12;
  Type local_11;
  Scope aScope_local;
  int8_t aValue_local;
  Tlv *pTStack_10;
  Type aType_local;
  Tlv *this_local;
  
  this->mScope = aScope;
  this->mType = aType;
  local_12 = aValue;
  local_11 = aType;
  pTStack_10 = this;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->mValue);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<signed_char&>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->mValue,&local_12);
  return;
}

Assistant:

Tlv::Tlv(Type aType, int8_t aValue, Scope aScope)
    : mScope(aScope)
    , mType(aType)
{
    mValue.emplace_back(aValue);
}